

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmHashEntryPLI::~CVmHashEntryPLI(CVmHashEntryPLI *this)

{
  void *in_RDI;
  
  ~CVmHashEntryPLI((CVmHashEntryPLI *)0x325238);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

CVmHashEntryPLI(vm_obj_id_t id)
        : CVmHashEntryCS((char *)&id, sizeof(id), TRUE)
    {
        /* 
         *   remember our object ID for easy access (technically, it's stored
         *   as our key value as well, so this is redundant; but it's
         *   transformed into a block of bytes for the key, so it's easier to
         *   keep a separate copy of the true type) 
         */
        id_ = id;

        /* initialize our status */
        status = PLI_UNINITED;
    }